

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

void glfwSetInputMode(GLFWwindow *handle,int mode,int value)

{
  GLFWbool GVar1;
  _func_void__GLFWwindow_ptr_int *UNRECOVERED_JUMPTABLE;
  int i;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  int code;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cal-cs184[P]hw0-intro/CGL/deps/glfw/src/input.c"
                  ,0x24e,"void glfwSetInputMode(GLFWwindow *, int, int)");
  }
  if (_glfw.initialized == 0) {
    code = 0x10001;
    pcVar4 = (char *)0x0;
LAB_00175d82:
    _glfwInputError(code,pcVar4);
    return;
  }
  uVar3 = (ulong)(uint)mode;
  switch(mode) {
  case 0x33001:
    if (value - 0x34005U < 0xfffffffc) {
      pcVar4 = "Invalid cursor mode 0x%08X";
      uVar3 = (ulong)(uint)value;
      goto LAB_00175e47;
    }
    if (*(int *)(handle + 0x84) != value) {
      *(int *)(handle + 0x84) = value;
      (*_glfw.platform.getCursorPos)
                ((_GLFWwindow *)handle,(double *)(handle + 0x1f0),(double *)(handle + 0x1f8));
      UNRECOVERED_JUMPTABLE = _glfw.platform.setCursorMode;
LAB_00175e99:
      (*UNRECOVERED_JUMPTABLE)((_GLFWwindow *)handle,value);
      return;
    }
    break;
  case 0x33002:
    if (*(uint *)(handle + 0x78) != (uint)(value != 0)) {
      if (value == 0) {
        lVar2 = 0x90;
        do {
          if (handle[lVar2] == (GLFWwindow)0x3) {
            handle[lVar2] = (GLFWwindow)0x0;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0x1ed);
      }
      *(uint *)(handle + 0x78) = (uint)(value != 0);
    }
    break;
  case 0x33003:
    if (*(uint *)(handle + 0x7c) != (uint)(value != 0)) {
      if (value == 0) {
        lVar2 = 0;
        do {
          if (handle[lVar2 + 0x88] == (GLFWwindow)0x3) {
            handle[lVar2 + 0x88] = (GLFWwindow)0x0;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 8);
      }
      *(uint *)(handle + 0x7c) = (uint)(value != 0);
    }
    break;
  case 0x33004:
    *(uint *)(handle + 0x80) = (uint)(value != 0);
    break;
  case 0x33005:
    GVar1 = (*_glfw.platform.rawMouseMotionSupported)();
    if (GVar1 == 0) {
      pcVar4 = "Raw mouse motion is not supported on this system";
      code = 0x10008;
      goto LAB_00175d82;
    }
    value = (int)(value != 0);
    if (*(uint *)(handle + 0x200) != value) {
      *(int *)(handle + 0x200) = value;
      UNRECOVERED_JUMPTABLE = (_func_void__GLFWwindow_ptr_int *)_glfw.platform.setRawMouseMotion;
      goto LAB_00175e99;
    }
    break;
  default:
    pcVar4 = "Invalid input mode 0x%08X";
LAB_00175e47:
    _glfwInputError(0x10003,pcVar4,uVar3);
    return;
  }
  return;
}

Assistant:

GLFWAPI void glfwSetInputMode(GLFWwindow* handle, int mode, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    switch (mode)
    {
        case GLFW_CURSOR:
        {
            if (value != GLFW_CURSOR_NORMAL &&
                value != GLFW_CURSOR_HIDDEN &&
                value != GLFW_CURSOR_DISABLED &&
                value != GLFW_CURSOR_CAPTURED)
            {
                _glfwInputError(GLFW_INVALID_ENUM,
                                "Invalid cursor mode 0x%08X",
                                value);
                return;
            }

            if (window->cursorMode == value)
                return;

            window->cursorMode = value;

            _glfw.platform.getCursorPos(window,
                                        &window->virtualCursorPosX,
                                        &window->virtualCursorPosY);
            _glfw.platform.setCursorMode(window, value);
            return;
        }

        case GLFW_STICKY_KEYS:
        {
            value = value ? GLFW_TRUE : GLFW_FALSE;
            if (window->stickyKeys == value)
                return;

            if (!value)
            {
                int i;

                // Release all sticky keys
                for (i = 0;  i <= GLFW_KEY_LAST;  i++)
                {
                    if (window->keys[i] == _GLFW_STICK)
                        window->keys[i] = GLFW_RELEASE;
                }
            }

            window->stickyKeys = value;
            return;
        }

        case GLFW_STICKY_MOUSE_BUTTONS:
        {
            value = value ? GLFW_TRUE : GLFW_FALSE;
            if (window->stickyMouseButtons == value)
                return;

            if (!value)
            {
                int i;

                // Release all sticky mouse buttons
                for (i = 0;  i <= GLFW_MOUSE_BUTTON_LAST;  i++)
                {
                    if (window->mouseButtons[i] == _GLFW_STICK)
                        window->mouseButtons[i] = GLFW_RELEASE;
                }
            }

            window->stickyMouseButtons = value;
            return;
        }

        case GLFW_LOCK_KEY_MODS:
        {
            window->lockKeyMods = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        }

        case GLFW_RAW_MOUSE_MOTION:
        {
            if (!_glfw.platform.rawMouseMotionSupported())
            {
                _glfwInputError(GLFW_PLATFORM_ERROR,
                                "Raw mouse motion is not supported on this system");
                return;
            }

            value = value ? GLFW_TRUE : GLFW_FALSE;
            if (window->rawMouseMotion == value)
                return;

            window->rawMouseMotion = value;
            _glfw.platform.setRawMouseMotion(window, value);
            return;
        }
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid input mode 0x%08X", mode);
}